

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

void parseGBCFile(filebuf *file)

{
  unsigned_short uVar1;
  size_type sVar2;
  size_type sVar3;
  char *pcVar4;
  char *pcVar5;
  value_type local_30;
  long local_20;
  streamsize len;
  char buf [8];
  filebuf *file_local;
  
  buf = (char  [8])file;
  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::clear
            (&options.palSpec);
  while( true ) {
    local_20 = std::streambuf::sgetn((char *)buf,(long)&len);
    if (local_20 == 0) {
      return;
    }
    if (local_20 != 8) break;
    uVar1 = readLE<unsigned_short,char>((char *)&len);
    local_30._M_elems[0] = Rgba::fromCGBColor(uVar1);
    uVar1 = readLE<unsigned_short,char>((char *)((long)&len + 2));
    local_30._M_elems[1] = Rgba::fromCGBColor(uVar1);
    uVar1 = readLE<unsigned_short,char>((char *)((long)&len + 4));
    local_30._M_elems[2] = Rgba::fromCGBColor(uVar1);
    uVar1 = readLE<unsigned_short,char>((char *)((long)&len + 6));
    local_30._M_elems[3] = Rgba::fromCGBColor(uVar1);
    std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::push_back
              (&options.palSpec,&local_30);
  }
  sVar2 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::size
                    (&options.palSpec);
  sVar3 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::size
                    (&options.palSpec);
  pcVar4 = "s";
  if (sVar3 == 1) {
    pcVar4 = "";
  }
  pcVar5 = "s";
  if (local_20 == 1) {
    pcVar5 = "";
  }
  error("GBC palette dump contains %zu 8-byte palette%s, plus %zu byte%s",sVar2,pcVar4,local_20,
        pcVar5);
  return;
}

Assistant:

static void parseGBCFile(std::filebuf &file) {
	// This only needs to be able to read back files generated by `rgbgfx -p`
	options.palSpec.clear();

	for (;;) {
		char buf[2 * 4];
		auto len = file.sgetn(buf, sizeof(buf));
		if (len == 0) {
			break;
		} else if (len != sizeof(buf)) {
			error("GBC palette dump contains %zu 8-byte palette%s, plus %zu byte%s",
			      options.palSpec.size(), options.palSpec.size() == 1 ? "" : "s", len,
			      len == 1 ? "" : "s");
			break;
		}

		options.palSpec.push_back({Rgba::fromCGBColor(readLE<uint16_t>(&buf[0])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[2])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[4])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[6]))});
	}
}